

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

NodePtr __thiscall dh::analysis::compound_stmt(analysis *this)

{
  bool bVar1;
  TYPE TVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar3;
  NodePtr tmp_in_ptr;
  NodePtr tmp_ptr;
  NodePtr tmp_cur_ptr;
  undefined1 local_d8 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_b0 [2];
  __shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> local_a0;
  string local_90;
  string local_70;
  string local_50;
  
  local_d8._0_4_ =
       token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  std::make_shared<dh::TreeNode,char_const(&)[3],int>((char (*) [3])this,(int *)"{}");
  local_d8._32_8_ = (FILE *)0x0;
  a_Stack_b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8._0_4_ = 4;
  TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_d8);
  local_d8._0_8_ = (ulong)(uint)local_d8._4_4_ << 0x20;
  TreeNode::setKind(*(TreeNode **)this,(int *)local_d8);
  std::__cxx11::string::string((string *)&local_70,"{",(allocator *)local_d8);
  match(in_RSI,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar2 != INT) {
    TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    if (TVar2 != VOID) {
      TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar2 != FLOAT) {
        TVar2 = token::getType((in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (TVar2 != BOOLEAN) goto LAB_00114ecb;
      }
    }
  }
  var_decl((analysis *)local_d8);
  std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x20),
             (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
LAB_00114ecb:
  std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a0,(__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x20));
  do {
    TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    if (TVar2 != INT) {
      TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar2 != VOID) {
        TVar2 = token::getType((in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (TVar2 != FLOAT) {
          TVar2 = token::getType((in_RSI->tmp).
                                 super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if (TVar2 != BOOLEAN) break;
        }
      }
    }
    var_decl((analysis *)local_d8);
    TreeNode::setSibling(local_a0._M_ptr,(NodePtr *)local_d8);
    std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_a0,(__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  } while( true );
  TreeNode::appendChild(*(TreeNode **)this,(NodePtr *)(local_d8 + 0x20));
  local_d8._0_8_ = (element_type *)0x0;
  local_d8._8_8_ = (element_type *)0x0;
  std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x20),
             (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar2 != BREAK) {
    TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    if (TVar2 != RETURN) {
      TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar2 != IF) {
        TVar2 = token::getType((in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (TVar2 != CONTINUE) {
          TVar2 = token::getType((in_RSI->tmp).
                                 super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if (TVar2 != FOR) {
            TVar2 = token::getType((in_RSI->tmp).
                                   super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
            if (TVar2 != WHILE) {
              TVar2 = token::getType((in_RSI->tmp).
                                     super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr);
              if (TVar2 != ID) {
                token::getVal_abi_cxx11_
                          ((string *)local_d8,
                           (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_d8,"{");
                if (bVar1) {
                  std::__cxx11::string::~string((string *)local_d8);
                }
                else {
                  token::getVal_abi_cxx11_
                            (&local_50,
                             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
                  bVar1 = std::operator==(&local_50,"(");
                  std::__cxx11::string::~string((string *)&local_50);
                  std::__cxx11::string::~string((string *)local_d8);
                  if (!bVar1) goto LAB_00115093;
                }
              }
            }
          }
        }
      }
    }
  }
  stmt((analysis *)local_d8);
  std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x20),
             (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
LAB_00115093:
  std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_a0,(__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 0x20));
  do {
    TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
    if (TVar2 != BREAK) {
      TVar2 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
      if (TVar2 != RETURN) {
        TVar2 = token::getType((in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (TVar2 != IF) {
          TVar2 = token::getType((in_RSI->tmp).
                                 super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if (TVar2 != CONTINUE) {
            TVar2 = token::getType((in_RSI->tmp).
                                   super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
            if (TVar2 != FOR) {
              TVar2 = token::getType((in_RSI->tmp).
                                     super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr);
              if (TVar2 != WHILE) {
                TVar2 = token::getType((in_RSI->tmp).
                                       super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_ptr);
                if (TVar2 != ID) {
                  token::getVal_abi_cxx11_
                            ((string *)local_d8,
                             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_d8,"{");
                  if (bVar1) {
                    std::__cxx11::string::~string((string *)local_d8);
                  }
                  else {
                    token::getVal_abi_cxx11_
                              (&local_50,
                               (in_RSI->tmp).
                               super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
                    bVar1 = std::operator==(&local_50,"(");
                    std::__cxx11::string::~string((string *)&local_50);
                    std::__cxx11::string::~string((string *)local_d8);
                    if (!bVar1) {
                      TreeNode::appendChild(*(TreeNode **)this,(NodePtr *)(local_d8 + 0x20));
                      std::__cxx11::string::string((string *)&local_90,"}",(allocator *)local_d8);
                      match(in_RSI,&local_90);
                      std::__cxx11::string::~string((string *)&local_90);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                                (&local_a0._M_refcount);
                      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_b0);
                      NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                      ._M_pi = extraout_RDX._M_pi;
                      NVar3.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                           (element_type *)this;
                      return (NodePtr)NVar3.
                                      super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    stmt((analysis *)local_d8);
    TreeNode::setSibling(local_a0._M_ptr,(NodePtr *)local_d8);
    std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_a0,(__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
  } while( true );
}

Assistant:

NodePtr analysis::compound_stmt()
{
#ifdef _DEBGU_
	::std::cout << "[DEBUG] in compound_stmt \n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>("{}",tmp->getLineno());
	NodePtr tmp_ptr = nullptr;
	ret->setNodeKind(NodeKind::StmtK);
	ret->setKind(StmtKind::ComK);

	match("{");

	if ( tmp->getType() == TYPE::INT
			|| tmp->getType() == TYPE::VOID
			|| tmp->getType() == TYPE::FLOAT
			|| tmp->getType() == TYPE::BOOLEAN)
	{
		tmp_ptr = var_decl();
	}

	NodePtr tmp_cur_ptr = tmp_ptr;
	while(tmp->getType() == TYPE::INT
			|| tmp->getType() == TYPE::VOID
			|| tmp->getType() == TYPE::FLOAT
			|| tmp->getType() == TYPE::BOOLEAN)
	{
		NodePtr tmp_in_ptr = var_decl();
		tmp_cur_ptr->setSibling(tmp_in_ptr);
		tmp_cur_ptr = tmp_in_ptr;
	}
	ret->appendChild(tmp_ptr);

	tmp_ptr = nullptr;
	if ( tmp->getType() == TYPE::BREAK
			|| tmp->getType() == TYPE::RETURN
			|| tmp->getType() == TYPE::IF
			|| tmp->getType() == TYPE::CONTINUE
			|| tmp->getType() == TYPE::FOR
			|| tmp->getType() == TYPE::WHILE
			|| tmp->getType() == TYPE::ID
			|| tmp->getVal() == "{"
			|| tmp->getVal() == "(")
	{
		tmp_ptr = stmt();
	}

	tmp_cur_ptr = tmp_ptr;
	while ( tmp->getType() == TYPE::BREAK
			|| tmp->getType() == TYPE::RETURN
			|| tmp->getType() == TYPE::IF
			|| tmp->getType() == TYPE::CONTINUE
			|| tmp->getType() == TYPE::FOR
			|| tmp->getType() == TYPE::WHILE
			|| tmp->getType() == TYPE::ID
			|| tmp->getVal() == "{"
			|| tmp->getVal() == "(")
	{
		NodePtr tmp_in_ptr = stmt();
		tmp_cur_ptr->setSibling(tmp_in_ptr);
		tmp_cur_ptr = tmp_in_ptr;
	}
	ret->appendChild(tmp_ptr);

	match("}");

	return ret;
}